

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void expand_object(tgestate_t *state,object_t index,uint8_t *output)

{
  byte *pbVar1;
  byte bVar2;
  tgeobject_t *ptVar3;
  long lVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint8_t uVar9;
  uint uVar10;
  
  ptVar3 = interior_object_defs[index];
  bVar2 = ptVar3->width;
  uVar6 = (uint)ptVar3->height;
  puVar5 = ptVar3->data;
  lVar4 = (long)state->columns - (ulong)bVar2;
  uVar7 = (uint)bVar2;
  do {
    bVar8 = *puVar5;
    while (bVar8 == 0xff) {
      bVar8 = puVar5[1];
      if (bVar8 == 0xff) {
        puVar5 = puVar5 + 1;
        uVar9 = 0xff;
        goto LAB_00105eff;
      }
      if ((char)bVar8 < '\0') {
        uVar10 = bVar8 & 0x7f;
        uVar9 = puVar5[2];
        do {
          if (uVar9 != '\0') {
            *output = uVar9;
          }
          output = output + 1;
          uVar7 = uVar7 - 1;
          if (uVar7 == 0) {
            uVar6 = uVar6 - 1;
            if (uVar6 == 0) {
              return;
            }
            output = output + lVar4;
            uVar7 = (uint)bVar2;
          }
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      else {
        uVar10 = bVar8 & 0x70;
        if (uVar10 != 0x40) {
          puVar5 = puVar5 + 1;
          goto LAB_00105efa;
        }
        uVar10 = bVar8 & 0xf;
        uVar9 = puVar5[2];
        do {
          *output = uVar9;
          output = output + 1;
          uVar7 = uVar7 - 1;
          if (uVar7 == 0) {
            uVar6 = uVar6 - 1;
            if (uVar6 == 0) {
              return;
            }
            output = output + lVar4;
            uVar7 = (uint)bVar2;
          }
          uVar9 = uVar9 + '\x01';
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      pbVar1 = puVar5 + 3;
      puVar5 = puVar5 + 3;
      bVar8 = *pbVar1;
    }
    uVar10 = (uint)bVar8;
LAB_00105efa:
    uVar9 = (uint8_t)uVar10;
    if (uVar10 != 0) {
LAB_00105eff:
      *output = uVar9;
    }
    puVar5 = puVar5 + 1;
    output = output + 1;
    uVar7 = uVar7 - 1;
    if (uVar7 == 0) {
      output = output + lVar4;
      uVar6 = uVar6 - 1;
      uVar7 = (uint)bVar2;
      if (uVar6 == 0) {
        return;
      }
    }
  } while( true );
}

Assistant:

void expand_object(tgestate_t *state, object_t index, uint8_t *output)
{
  int                columns;       /* new var */
  const tgeobject_t *obj;           /* was HL */
  int                width, height; /* was B, C */
  int                self_width;    /* was $6AE7 */
  const uint8_t     *data;          /* was HL */
  int                byte;          /* was A */
  int                val;           /* was A' */

  assert(state  != NULL);
  assert(index < interiorobject__LIMIT);
  assert(output != NULL); // assert within tilebuf?

  columns     = state->columns; // Conv: Added.

  assert(columns == 24); // did i add this for any particular reason?

  obj         = interior_object_defs[index];

  width       = obj->width;
  height      = obj->height;

  self_width  = width;

  data        = &obj->data[0];

  assert(width  > 0);
  assert(height > 0);

  do
  {
    do
    {
expand:
      assert(width  > 0);
      assert(height > 0);

      byte = *data;
      if (byte == interiortile_ESCAPE)
      {
        byte = *++data;
        if (byte != interiortile_ESCAPE)
        {
          byte &= 0xF0;
          if (byte >= 128)
            goto repetition;
          if (byte == 64)
            goto range;
          assert(0);
        }
      }

      if (byte)
        *output = byte;
      data++;
      output++;
    }
    while (--width);

    width = self_width;
    output += columns - width; /* move to next row */
  }
  while (--height);

  return;


repetition:
  byte = *data++ & 0x7F;
  val = *data;
  do
  {
    if (val > 0)
      *output = val;
    output++;

    if (--width == 0) /* ran out of width */
    {
      width = self_width;
      output += columns - width; /* move to next row */

      // val = *data; // needless reload in C version (required in original)

      if (--height == 0)
        return;
    }
  }
  while (--byte);

  data++;

  goto expand;


range:
  byte = *data++ & 0x0F;
  val = *data;
  do
  {
    *output++ = val++;

    if (--width == 0) /* ran out of width */
    {
      width = self_width;
      output += columns - self_width; /* move to next row */

      if (--height == 0)
        return;
    }
  }
  while (--byte);

  data++;

  goto expand;
}